

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O2

SortedRun *
SortedRun::pick_common
          (SortedRun *__return_storage_ptr__,int cutoff,
          vector<SortedRun_*,_std::allocator<SortedRun_*>_> *sources)

{
  uint uVar1;
  pointer ppSVar2;
  SortedRun *this;
  iterator iVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  uint uVar7;
  int i;
  int iVar8;
  pointer ppSVar9;
  ulong uVar10;
  pointer ppVar11;
  FileId *pFVar12;
  ulong uVar13;
  int iVar14;
  FileId min_id;
  undefined4 uStack_74;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  heads;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  heads.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  heads.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  heads.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::reserve(&heads,(long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3);
  ppSVar2 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar9 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppSVar9 != ppSVar2; ppSVar9 = ppSVar9 + 1) {
    this = *ppSVar9;
    decompress(this);
    if (((this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       ((this->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      iVar3 = begin(this);
      local_70._M_current = (uint *)end(this);
      _min_id = iVar3;
      std::
      vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
      ::
      emplace_back<std::pair<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                ((vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                  *)&heads,
                 (pair<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&min_id);
    }
  }
  while (iVar14 = (int)((ulong)((long)heads.
                                      super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)heads.
                                     super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4),
        cutoff <= iVar14) {
    uVar7 = *((heads.
               super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first)._M_current;
    min_id = uVar7;
    uVar10 = 0;
    ppVar4 = heads.
             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar13 = 1; ppVar4 = ppVar4 + 1, (long)uVar13 < (long)iVar14; uVar13 = uVar13 + 1) {
      uVar1 = *(ppVar4->first)._M_current;
      if (uVar1 < uVar7) {
        min_id = uVar1;
        uVar10 = uVar13 & 0xffffffff;
        uVar7 = uVar1;
      }
    }
    iVar14 = 0;
    ppVar4 = heads.
             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar6 = heads.
             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = heads.
              super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (iVar8 = (int)uVar10, iVar8 < (int)((ulong)((long)ppVar4 - (long)ppVar6) >> 4)) {
      pFVar12 = ppVar6[iVar8].first._M_current;
      if (*pFVar12 == min_id) {
        ppVar5 = ppVar6 + iVar8;
        iVar14 = iVar14 + 1;
        pFVar12 = pFVar12 + 1;
        (ppVar5->first)._M_current = pFVar12;
        ppVar6 = ppVar11;
        if (pFVar12 == (ppVar5->second)._M_current) {
          std::
          vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          ::erase(&heads,ppVar11 + iVar8);
          iVar8 = iVar8 + -1;
          ppVar4 = heads.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar6 = heads.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar11 = heads.
                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar10 = (ulong)(iVar8 + 1);
    }
    if (cutoff <= iVar14) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&result,&min_id);
    }
  }
  (__return_storage_ptr__->sequence_).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (__return_storage_ptr__->sequence_).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->sequence_).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~_Vector_base(&heads.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

SortedRun SortedRun::pick_common(int cutoff,
                                 std::vector<SortedRun *> &sources) {
    // returns all FileIds which appear at least `cutoff` times among provided
    // `sources`
    using FileIdRange = std::pair<std::vector<FileId>::const_iterator,
                                  std::vector<FileId>::const_iterator>;
    std::vector<FileId> result;
    std::vector<FileIdRange> heads;
    heads.reserve(sources.size());

    for (auto source : sources) {
        source->decompress();
        if (!source->empty()) {
            heads.emplace_back(std::make_pair(source->begin(), source->end()));
        }
    }

    while (static_cast<int>(heads.size()) >= cutoff) {
        // pick lowest possible FileId value among all current heads
        int min_index = 0;
        FileId min_id = *heads[0].first;
        for (int i = 1; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first < min_id) {
                min_index = i;
                min_id = *heads[i].first;
            }
        }

        // fix on that particular value selected in previous step and count
        // number of repetitions among heads.
        // Note that it's implementation-defined that std::vector<FileId>
        // is always sorted and we use this fact here.
        int repeat_count = 0;
        for (int i = min_index; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first == min_id) {
                repeat_count += 1;
                heads[i].first++;
                // head ended, we may get rid of it
                if (heads[i].first == heads[i].second) {
                    heads.erase(heads.begin() + i);
                    i--;  // Be careful not to skip elements!
                }
            }
        }

        // this value has enough repetitions among different heads to add it to
        // the result set
        if (repeat_count >= cutoff) {
            result.push_back(min_id);
        }
    }

    return SortedRun(std::move(result));
}